

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unify_const_pass.cpp
# Opt level: O2

Status __thiscall spvtools::opt::UnifyConstantPass::Process(UnifyConstantPass *this)

{
  _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_unsigned_int,_std::unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>_>,_false>_>_>
  *p_Var1;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this_00;
  Op OVar2;
  pointer pOVar3;
  uint **ppuVar4;
  uint *__first;
  _Hash_node_base *p_Var5;
  _Hash_node_base _Var6;
  IRContext *this_01;
  pointer puVar7;
  pointer puVar8;
  Instruction *this_02;
  Status SVar9;
  uint32_t uVar10;
  key_type_conflict after;
  DefUseManager *this_03;
  __node_ptr p_Var11;
  undefined4 *puVar12;
  __node_ptr p_Var13;
  _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_unsigned_int,_std::unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>_>,_false>_>_>
  *__s;
  _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_unsigned_int,_std::unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>_>,_false>_>_>
  *p_Var14;
  Instruction *pIVar15;
  _Head_base<0UL,_spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node_*,_false> _Var16;
  uint **ppuVar17;
  _Head_base<0UL,_spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node_*,_false> _Var18;
  __node_ptr __bkt;
  size_type __n;
  ulong uVar19;
  ulong uVar20;
  __node_ptr __n_00;
  _Hash_node_base *p_Var21;
  _Head_base<0UL,_spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node_*,_false> _Var22;
  __hash_code __code;
  Operand *operand;
  pointer pOVar23;
  Op *pOVar24;
  undefined1 auVar25 [16];
  Op local_bc;
  __buckets_alloc_type __alloc;
  vector<unsigned_int,_std::allocator<unsigned_int>_> keys;
  Instruction *local_80;
  ResultIdTrie defined_constants;
  Op local_68 [2];
  __uniq_ptr_impl<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>
  local_60;
  Instruction *local_58;
  ulong local_50;
  ulong local_48;
  Op *local_40;
  __uniq_ptr_impl<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>
  local_38;
  
  defined_constants.root_._M_t.
  super___uniq_ptr_impl<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node_*,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>
  .super__Head_base<0UL,_spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node_*,_false>.
  _M_head_impl = (unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>
                  )::operator_new(0x40);
  *(undefined4 *)
   defined_constants.root_._M_t.
   super___uniq_ptr_impl<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>
   ._M_t.
   super__Tuple_impl<0UL,_spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node_*,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>
   .super__Head_base<0UL,_spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node_*,_false>.
   _M_head_impl = 0;
  *(undefined8 *)
   ((long)defined_constants.root_._M_t.
          super___uniq_ptr_impl<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>
          ._M_t.
          super__Tuple_impl<0UL,_spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node_*,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>
          .super__Head_base<0UL,_spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node_*,_false>.
          _M_head_impl + 0x28) = 0;
  *(undefined4 **)
   ((long)defined_constants.root_._M_t.
          super___uniq_ptr_impl<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>
          ._M_t.
          super__Tuple_impl<0UL,_spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node_*,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>
          .super__Head_base<0UL,_spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node_*,_false>.
          _M_head_impl + 8) =
       (undefined4 *)
       ((long)defined_constants.root_._M_t.
              super___uniq_ptr_impl<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node_*,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>
              .
              super__Head_base<0UL,_spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node_*,_false>
              ._M_head_impl + 0x38);
  *(undefined8 *)
   ((long)defined_constants.root_._M_t.
          super___uniq_ptr_impl<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>
          ._M_t.
          super__Tuple_impl<0UL,_spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node_*,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>
          .super__Head_base<0UL,_spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node_*,_false>.
          _M_head_impl + 0x10) = 1;
  *(undefined8 *)
   ((long)defined_constants.root_._M_t.
          super___uniq_ptr_impl<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>
          ._M_t.
          super__Tuple_impl<0UL,_spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node_*,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>
          .super__Head_base<0UL,_spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node_*,_false>.
          _M_head_impl + 0x18) = 0;
  *(undefined8 *)
   ((long)defined_constants.root_._M_t.
          super___uniq_ptr_impl<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>
          ._M_t.
          super__Tuple_impl<0UL,_spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node_*,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>
          .super__Head_base<0UL,_spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node_*,_false>.
          _M_head_impl + 0x20) = 0;
  *(undefined4 *)
   ((long)defined_constants.root_._M_t.
          super___uniq_ptr_impl<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>
          ._M_t.
          super__Tuple_impl<0UL,_spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node_*,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>
          .super__Head_base<0UL,_spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node_*,_false>.
          _M_head_impl + 0x28) = 0x3f800000;
  *(undefined8 *)
   ((long)defined_constants.root_._M_t.
          super___uniq_ptr_impl<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>
          ._M_t.
          super__Tuple_impl<0UL,_spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node_*,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>
          .super__Head_base<0UL,_spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node_*,_false>.
          _M_head_impl + 0x30) = 0;
  *(undefined8 *)
   ((long)defined_constants.root_._M_t.
          super___uniq_ptr_impl<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>
          ._M_t.
          super__Tuple_impl<0UL,_spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node_*,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>
          .super__Head_base<0UL,_spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node_*,_false>.
          _M_head_impl + 0x38) = 0;
  SVar9 = SuccessWithoutChange;
  pIVar15 = *(Instruction **)
             ((long)&(((((this->super_Pass).context_)->module_)._M_t.
                       super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                       .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl)->
                     types_values_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
  do {
    do {
      do {
        local_80 = pIVar15;
        if (local_80 == (Instruction *)0x0) {
          std::
          unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>
          ::~unique_ptr(&defined_constants.root_);
          return SVar9;
        }
        pIVar15 = (local_80->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
        if ((pIVar15->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false) {
          pIVar15 = (Instruction *)0x0;
        }
        this_03 = Pass::get_def_use_mgr(&this->super_Pass);
        uVar10 = Instruction::result_id(local_80);
        analysis::DefUseManager::GetAnnotations
                  ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                    *)&keys,this_03,uVar10);
        puVar8 = keys.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        puVar7 = keys.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        std::
        _Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
        ~_Vector_base((_Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                       *)&keys);
      } while (puVar8 != puVar7);
      OVar2 = local_80->opcode_;
    } while ((0x34 < (ulong)OVar2) ||
            (_Var16._M_head_impl = (Node *)0x187e0000000000,
            (0x187e0000000000U >> ((ulong)OVar2 & 0x3f) & 1) == 0));
    keys.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    keys.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    keys.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_68[0] = OVar2;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (&keys,local_68);
    pOVar23 = (local_80->operands_).
              super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
              _M_impl.super__Vector_impl_data._M_start;
    local_58 = local_80;
    pOVar3 = (local_80->operands_).
             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (; puVar7 = keys.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish,
        _Var18._M_head_impl =
             (Node *)defined_constants.root_._M_t.
                     super___uniq_ptr_impl<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node_*,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>
                     .
                     super__Head_base<0UL,_spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node_*,_false>
                     ._M_head_impl,
        pOVar24 = keys.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start, pOVar23 != pOVar3; pOVar23 = pOVar23 + 1) {
      if (pOVar23->type != SPV_OPERAND_TYPE_RESULT_ID) {
        ppuVar4 = (uint **)(pOVar23->words).large_data_._M_t.
                           super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           .
                           super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                           ._M_head_impl;
        ppuVar17 = &(pOVar23->words).small_data_;
        if (ppuVar4 != (uint **)0x0) {
          ppuVar17 = ppuVar4;
        }
        __first = *ppuVar17;
        _Var16._M_head_impl = (Node *)utils::SmallVector<unsigned_int,_2UL>::end(&pOVar23->words);
        std::vector<unsigned_int,std::allocator<unsigned_int>>::insert<unsigned_int_const*,void>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)&keys,(const_iterator)puVar7
                   ,__first,(uint *)_Var16._M_head_impl);
      }
    }
    for (; this_02 = local_58, pOVar24 != puVar7; pOVar24 = pOVar24 + 1) {
      OVar2 = *pOVar24;
      uVar20 = (ulong)OVar2;
      this_00 = (_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)((long)_Var18._M_head_impl + 8);
      local_bc = OVar2;
      p_Var11 = std::
                _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::_M_find_node(this_00,uVar20 % *(ulong *)((long)_Var18._M_head_impl + 0x10),
                               &local_bc,(__hash_code)_Var16._M_head_impl);
      if (p_Var11 == (__node_ptr)0x0) {
        local_40 = pOVar24;
        puVar12 = (undefined4 *)::operator_new(0x40);
        *puVar12 = 0;
        *(undefined8 *)(puVar12 + 10) = 0;
        *(undefined4 **)(puVar12 + 2) = puVar12 + 0xe;
        *(undefined8 *)(puVar12 + 4) = 1;
        *(undefined8 *)(puVar12 + 6) = 0;
        *(undefined8 *)(puVar12 + 8) = 0;
        puVar12[10] = 0x3f800000;
        *(undefined8 *)(puVar12 + 0xc) = 0;
        *(undefined8 *)(puVar12 + 0xe) = 0;
        local_38._M_t.
        super__Tuple_impl<0UL,_spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node_*,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>
        .super__Head_base<0UL,_spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node_*,_false>.
        _M_head_impl = (tuple<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node_*,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>
                        )(_Tuple_impl<0UL,_spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node_*,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>
                          )0x0;
        local_68[0] = OVar2;
        p_Var11 = (__node_ptr)::operator_new(0x18);
        (p_Var11->super__Hash_node_base)._M_nxt = (_Hash_node_base *)0x0;
        _Var16._M_head_impl =
             (Node *)&p_Var11->
                      super__Hash_node_value<std::pair<const_unsigned_int,_std::unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>_>,_false>
        ;
        *(Op *)&p_Var11->
                super__Hash_node_value<std::pair<const_unsigned_int,_std::unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>_>,_false>
             = OVar2;
        *(undefined4 **)
         ((long)&p_Var11->
                 super__Hash_node_value<std::pair<const_unsigned_int,_std::unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>_>,_false>
         + 8) = puVar12;
        local_60._M_t.
        super__Tuple_impl<0UL,_spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node_*,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>
        .super__Head_base<0UL,_spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node_*,_false>.
        _M_head_impl = (tuple<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node_*,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>
                        )(_Tuple_impl<0UL,_spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node_*,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>
                          )0x0;
        local_48 = *(ulong *)((long)_Var18._M_head_impl + 0x10);
        __bkt = (__node_ptr)(uVar20 % local_48);
        __n_00 = __bkt;
        p_Var13 = std::
                  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::_M_find_node(this_00,(size_type)__bkt,(key_type_conflict *)_Var16._M_head_impl,
                                 (__hash_code)_Var16._M_head_impl);
        if (p_Var13 == (__node_ptr)0x0) {
          local_50 = uVar20;
          auVar25 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                              ((ulong)((long)_Var18._M_head_impl + 0x28),local_48,
                               *(ulong *)((long)_Var18._M_head_impl + 0x20));
          __n = auVar25._8_8_;
          if ((auVar25 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            __s = (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_unsigned_int,_std::unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>_>,_false>_>_>
                   *)this_00->_M_buckets;
          }
          else {
            if (__n == 1) {
              __s = (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_unsigned_int,_std::unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>_>,_false>_>_>
                     *)((long)_Var18._M_head_impl + 0x38);
              *(undefined8 *)((long)_Var18._M_head_impl + 0x38) = 0;
            }
            else {
              __s = (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_unsigned_int,_std::unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>_>,_false>_>_>
                     *)std::allocator_traits<std::allocator<std::__detail::_Hash_node_base_*>_>::
                       allocate(&__alloc,__n);
              memset(__s,0,__n * 8);
            }
            p_Var1 = (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_unsigned_int,_std::unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>_>,_false>_>_>
                      *)((long)_Var18._M_head_impl + 0x18);
            p_Var5 = *(_Hash_node_base **)((long)_Var18._M_head_impl + 0x18);
            *(undefined8 *)((long)_Var18._M_head_impl + 0x18) = 0;
            uVar20 = 0;
LAB_00474c8b:
            p_Var21 = p_Var5;
            uVar19 = uVar20;
            if (p_Var21 != (_Hash_node_base *)0x0) {
              p_Var5 = p_Var21->_M_nxt;
              uVar20 = (ulong)*(uint *)&p_Var21[1]._M_nxt % __n;
              if (*(__node_base_ptr *)(__s + uVar20 * 8) == (__node_base_ptr)0x0) goto LAB_00474cba;
              p_Var21->_M_nxt = (*(__node_base_ptr *)(__s + uVar20 * 8))->_M_nxt;
              p_Var14 = *(_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_unsigned_int,_std::unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>_>,_false>_>_>
                          **)(__s + uVar20 * 8);
              uVar20 = uVar19;
              goto LAB_00474cd1;
            }
            std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::_M_deallocate_buckets(this_00);
            *(size_type *)((long)_Var18._M_head_impl + 0x10) = __n;
            *(_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_unsigned_int,_std::unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>_>,_false>_>_>
              **)((long)_Var18._M_head_impl + 8) = __s;
            __bkt = (__node_ptr)(local_50 % __n);
          }
          if (*(__node_base_ptr *)(__s + (long)__bkt * 8) == (__node_base_ptr)0x0) {
            _Var6._M_nxt = *(_Hash_node_base **)((long)_Var18._M_head_impl + 0x18);
            (p_Var11->super__Hash_node_base)._M_nxt = _Var6._M_nxt;
            *(__node_ptr *)((long)_Var18._M_head_impl + 0x18) = p_Var11;
            if (_Var6._M_nxt != (_Hash_node_base *)0x0) {
              *(__node_ptr *)
               (__s + ((ulong)*(uint *)&_Var6._M_nxt[1]._M_nxt %
                      *(ulong *)((long)_Var18._M_head_impl + 0x10)) * 8) = p_Var11;
              __s = *(_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_unsigned_int,_std::unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>_>,_false>_>_>
                      **)((long)_Var18._M_head_impl + 8);
            }
            *(_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_unsigned_int,_std::unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>_>,_false>_>_>
              **)(__s + (long)__bkt * 8) =
                 (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_unsigned_int,_std::unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>_>,_false>_>_>
                  *)((long)_Var18._M_head_impl + 0x18);
          }
          else {
            (p_Var11->super__Hash_node_base)._M_nxt =
                 (*(__node_base_ptr *)(__s + (long)__bkt * 8))->_M_nxt;
            (*(__node_base_ptr *)(__s + (long)__bkt * 8))->_M_nxt = (_Hash_node_base *)p_Var11;
          }
          *(long *)((long)_Var18._M_head_impl + 0x20) =
               *(long *)((long)_Var18._M_head_impl + 0x20) + 1;
        }
        else {
          std::__detail::
          _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_unsigned_int,_std::unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>_>,_false>_>_>
          ::_M_deallocate_node
                    ((_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_unsigned_int,_std::unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>_>,_false>_>_>
                      *)p_Var11,__n_00);
          _Var18._M_head_impl = _Var16._M_head_impl;
          p_Var11 = p_Var13;
        }
        _Var22._M_head_impl =
             *(Node **)((long)&(p_Var11->
                               super__Hash_node_value<std::pair<const_unsigned_int,_std::unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>_>,_false>
                               ).
                               super__Hash_node_value_base<std::pair<const_unsigned_int,_std::unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>_>_>
                               ._M_storage._M_storage + 8);
        std::
        unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>
        ::~unique_ptr((unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>
                       *)&local_60);
        std::
        unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>
        ::~unique_ptr((unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>
                       *)&local_38);
        pOVar24 = local_40;
      }
      else {
        _Var22._M_head_impl =
             *(Node **)&((tuple<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node_*,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>
                          *)((long)&(p_Var11->
                                    super__Hash_node_value<std::pair<const_unsigned_int,_std::unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>_>,_false>
                                    ).
                                    super__Hash_node_value_base<std::pair<const_unsigned_int,_std::unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>_>_>
                                    ._M_storage._M_storage + 8))->
                        super__Tuple_impl<0UL,_spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node_*,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>
        ;
        _Var18._M_head_impl = _Var16._M_head_impl;
      }
      _Var16._M_head_impl = _Var18._M_head_impl;
      _Var18._M_head_impl = _Var22._M_head_impl;
    }
    after = (_Var18._M_head_impl)->result_id_;
    if (after == 0) {
      after = Instruction::result_id(local_58);
      (_Var18._M_head_impl)->result_id_ = after;
    }
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&keys.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    uVar10 = Instruction::result_id(this_02);
    if (after != uVar10) {
      this_01 = (this->super_Pass).context_;
      uVar10 = Instruction::result_id(this_02);
      IRContext::ReplaceAllUsesWith(this_01,uVar10,after);
      IRContext::KillInst((this->super_Pass).context_,this_02);
      SVar9 = SuccessWithChange;
    }
  } while( true );
LAB_00474cba:
  p_Var21->_M_nxt = *(_Hash_node_base **)&p_Var1->field_0x0;
  *(_Hash_node_base **)&p_Var1->field_0x0 = p_Var21;
  *(_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_unsigned_int,_std::unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>_>,_false>_>_>
    **)(__s + uVar20 * 8) = p_Var1;
  if (p_Var21->_M_nxt != (_Hash_node_base *)0x0) {
    p_Var14 = __s + uVar19 * 8;
LAB_00474cd1:
    *(_Hash_node_base **)&p_Var14->field_0x0 = p_Var21;
  }
  goto LAB_00474c8b;
}

Assistant:

Pass::Status UnifyConstantPass::Process() {
  bool modified = false;
  ResultIdTrie defined_constants;

  for (Instruction *next_instruction,
       *inst = &*(context()->types_values_begin());
       inst; inst = next_instruction) {
    next_instruction = inst->NextNode();

    // Do not handle the instruction when there are decorations upon the result
    // id.
    if (get_def_use_mgr()->GetAnnotations(inst->result_id()).size() != 0) {
      continue;
    }

    // The overall algorithm is to store the result ids of all the eligible
    // constants encountered so far in a trie. For a constant defining
    // instruction under consideration, use its opcode, result type id and
    // words in operands as an array of keys to lookup the trie. If a result id
    // can be found for that array of keys, a constant with exactly the same
    // value must has been defined before, the constant under processing
    // should be replaced by the constant previously defined. If no such result
    // id can be found for that array of keys, this must be the first time a
    // constant with its value be defined, we then create a new trie node to
    // store the result id with the keys. When replacing a duplicated constant
    // with a previously defined constant, all the uses of the duplicated
    // constant, which must be placed after the duplicated constant defining
    // instruction, will be updated. This way, the descendants of the
    // previously defined constant and the duplicated constant will both refer
    // to the previously defined constant. So that the operand ids which are
    // used in key arrays will be the ids of the unified constants, when
    // processing is up to a descendant. This makes comparing the key array
    // always valid for judging duplication.
    switch (inst->opcode()) {
      case spv::Op::OpConstantTrue:
      case spv::Op::OpConstantFalse:
      case spv::Op::OpConstant:
      case spv::Op::OpConstantNull:
      case spv::Op::OpConstantSampler:
      case spv::Op::OpConstantComposite:
      // Only spec constants defined with OpSpecConstantOp and
      // OpSpecConstantComposite should be processed in this pass. Spec
      // constants defined with OpSpecConstant{|True|False} are decorated with
      // 'SpecId' decoration and all of them should be treated as unique.
      // 'SpecId' is not applicable to SpecConstants defined with
      // OpSpecConstant{Op|Composite}, their values are not necessary to be
      // unique. When all the operands/components are the same between two
      // OpSpecConstant{Op|Composite} results, their result values must be the
      // same so are unifiable.
      case spv::Op::OpSpecConstantOp:
      case spv::Op::OpSpecConstantComposite: {
        uint32_t id = defined_constants.LookupEquivalentResultFor(*inst);
        if (id != inst->result_id()) {
          // The constant is a duplicated one, use the cached constant to
          // replace the uses of this duplicated one, then turn it to nop.
          context()->ReplaceAllUsesWith(inst->result_id(), id);
          context()->KillInst(inst);
          modified = true;
        }
        break;
      }
      default:
        break;
    }
  }
  return modified ? Status::SuccessWithChange : Status::SuccessWithoutChange;
}